

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::Plus(Regexp *sub,ParseFlags flags)

{
  RegexpOp RVar1;
  ParseFlags PVar2;
  Regexp **ppRVar3;
  Regexp *re;
  ParseFlags flags_local;
  Regexp *sub_local;
  
  RVar1 = op(sub);
  if ((RVar1 != kRegexpPlus) || (PVar2 = parse_flags(sub), sub_local = sub, PVar2 != flags)) {
    sub_local = (Regexp *)operator_new(0x28);
    Regexp(sub_local,kRegexpPlus,flags);
    AllocSub(sub_local,1);
    ppRVar3 = Regexp::sub(sub_local);
    *ppRVar3 = sub;
  }
  return sub_local;
}

Assistant:

Regexp* Regexp::Plus(Regexp* sub, ParseFlags flags) {
  if (sub->op() == kRegexpPlus && sub->parse_flags() == flags)
    return sub;
  Regexp* re = new Regexp(kRegexpPlus, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  return re;
}